

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatCxxExceptionMessage_abi_cxx11_(char *description,char *location)

{
  Message *this;
  Message *this_00;
  long in_RSI;
  string *in_RDI;
  Message message;
  char (*in_stack_ffffffffffffff98) [33];
  Message *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffd0;
  
  Message::Message(in_stack_ffffffffffffffd0);
  if (in_RSI == 0) {
    Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [22])in_stack_ffffffffffffff98);
  }
  else {
    Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Message::operator<<(in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
    Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
  }
  this = Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [12])in_stack_ffffffffffffff98);
  this_00 = Message::operator<<(in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
  Message::operator<<(this_00,(char (*) [2])in_stack_ffffffffffffff98);
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x253940);
  return in_RDI;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != nullptr) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}